

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O2

Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT> *
wasm::WATParser::heaptype<wasm::WATParser::ParseTypeDefsCtx>
          (Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>
           *__return_storage_ptr__,ParseTypeDefsCtx *ctx)

{
  Lexer *this;
  undefined8 uVar1;
  bool bVar2;
  _Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
  *p_Var3;
  _Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
  *p_Var4;
  string *this_00;
  string_view expected;
  string_view expected_00;
  string local_e0;
  string local_c0;
  undefined1 auStack_a0 [8];
  Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT> t;
  undefined1 local_58 [8];
  MaybeResult<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT> _val;
  
  maybeTypeidx<wasm::WATParser::ParseTypeDefsCtx>
            ((MaybeResult<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>
              *)auStack_a0,ctx);
  if (t.val.
      super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
      .
      super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
      .
      super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
      .
      super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
      .
      super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
      .
      super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
      ._M_u._24_1_ != '\x01') {
    std::__detail::__variant::
    _Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
                       *)local_58,
                      (_Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
                       *)auStack_a0);
    if (_val.val.
        super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
        .
        super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
        .
        super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
        .
        super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
        .
        super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
        .
        super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
        ._M_u._24_1_ == '\x02') {
      std::__cxx11::string::string
                ((string *)
                 ((long)&t.val.
                         super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                         .
                         super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                         .
                         super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                         .
                         super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                         .
                         super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                 + 0x20),(string *)local_58);
      std::__detail::__variant::
      _Variant_storage<false,wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,wasm::Err>
      ::_Variant_storage<1ul,wasm::Err>
                ((_Variant_storage<false,wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,wasm::Err>
                  *)__return_storage_ptr__,
                 (__index_type *)
                 ((long)&t.val.
                         super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                         .
                         super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                         .
                         super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                         .
                         super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                         .
                         super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                 + 0x20));
      std::__cxx11::string::~string
                ((string *)
                 ((long)&t.val.
                         super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                         .
                         super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                         .
                         super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                         .
                         super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                         .
                         super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                 + 0x20));
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
                           *)local_58);
    }
    else {
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
                           *)local_58);
      p_Var3 = (_Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
                *)0x0;
      if (t.val.
          super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
          .
          super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
          .
          super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
          .
          super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
          .
          super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
          .
          super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
          ._M_u._24_1_ == '\0') {
        p_Var3 = (_Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
                  *)auStack_a0;
      }
      uVar1 = *(undefined8 *)
               &(p_Var3->
                super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
                )._M_u._M_first._M_storage.exactness;
      *(uintptr_t *)
       &(__return_storage_ptr__->val).
        super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
        .
        super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
        .
        super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
        .
        super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
        .
        super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
        .
        super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
           = (p_Var3->
             super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
             )._M_u._M_first._M_storage.type.id;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
               .
               super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
               .
               super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
               .
               super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
               .
               super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
               .
               super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
       + 8) = uVar1;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
               .
               super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
               .
               super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
               .
               super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
               .
               super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
               .
               super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
       + 0x20) = '\0';
    }
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
    ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
                         *)auStack_a0);
    return __return_storage_ptr__;
  }
  std::__detail::__variant::
  _Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
  ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
                       *)auStack_a0);
  this = &ctx->in;
  expected._M_str = "exact";
  expected._M_len = 5;
  bVar2 = Lexer::takeSExprStart(this,expected);
  if (bVar2) {
    typeidx<wasm::WATParser::ParseTypeDefsCtx>
              ((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>
                *)auStack_a0,ctx);
    std::__detail::__variant::
    _Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                       *)local_58,
                      (_Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                       *)auStack_a0);
    if (_val.val.
        super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
        .
        super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
        .
        super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
        .
        super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
        .
        super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
        .
        super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
        ._M_u._24_1_ != '\x01') {
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                           *)local_58);
      bVar2 = Lexer::takeRParen(this);
      if (bVar2) {
        *(undefined1 (*) [8])
         &(__return_storage_ptr__->val).
          super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
          .
          super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
          .
          super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
          .
          super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
          .
          super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
          .
          super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
             = auStack_a0;
        *(undefined4 *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                 .
                 super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                 .
                 super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                 .
                 super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                 .
                 super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                 .
                 super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
         + 8) = 1;
LAB_00c349d8:
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                 .
                 super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                 .
                 super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                 .
                 super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                 .
                 super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                 .
                 super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
         + 0x20) = '\0';
        goto LAB_00c34a74;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e0,"expected end of exact heap type",
                 (allocator<char> *)
                 ((long)&t.val.
                         super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                         .
                         super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                         .
                         super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                         .
                         super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                         .
                         super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                 + 0x20));
      Lexer::err((Err *)local_58,this,&local_e0);
      std::__detail::__variant::
      _Variant_storage<false,wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,wasm::Err>
      ::_Variant_storage<1ul,wasm::Err>
                ((_Variant_storage<false,wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,wasm::Err>
                  *)__return_storage_ptr__,local_58);
      std::__cxx11::string::~string((string *)local_58);
      this_00 = &local_e0;
LAB_00c34a6f:
      std::__cxx11::string::~string((string *)this_00);
      goto LAB_00c34a74;
    }
    std::__cxx11::string::string
              ((string *)
               ((long)&t.val.
                       super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                       .
                       super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                       .
                       super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                       .
                       super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                       .
                       super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
               + 0x20),(string *)local_58);
    std::__detail::__variant::
    _Variant_storage<false,wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,wasm::Err>
    ::_Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,wasm::Err>
                *)__return_storage_ptr__,
               (__index_type *)
               ((long)&t.val.
                       super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                       .
                       super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                       .
                       super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                       .
                       super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                       .
                       super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
               + 0x20));
  }
  else {
    expected_00._M_str = "shared";
    expected_00._M_len = 6;
    bVar2 = Lexer::takeSExprStart(this,expected_00);
    absheaptype<wasm::WATParser::ParseTypeDefsCtx>
              ((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>
                *)auStack_a0,ctx,(uint)!bVar2);
    std::__detail::__variant::
    _Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                       *)local_58,
                      (_Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                       *)auStack_a0);
    if (_val.val.
        super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
        .
        super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
        .
        super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
        .
        super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
        .
        super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
        .
        super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::None,_wasm::Err>
        ._M_u._24_1_ != '\x01') {
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                           *)local_58);
      if ((!bVar2) || (bVar2 = Lexer::takeRParen(this), bVar2)) {
        p_Var4 = (_Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                  *)0x0;
        if (t.val.
            super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
            .
            super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
            .
            super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
            .
            super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
            .
            super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
            .
            super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
            ._M_u._24_1_ == '\0') {
          p_Var4 = (_Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                    *)auStack_a0;
        }
        uVar1 = *(undefined8 *)
                 &(p_Var4->
                  super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                  )._M_u._M_first._M_storage.exactness;
        *(uintptr_t *)
         &(__return_storage_ptr__->val).
          super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
          .
          super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
          .
          super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
          .
          super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
          .
          super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
          .
          super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
             = (p_Var4->
               super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
               )._M_u._M_first._M_storage.type.id;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                 .
                 super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                 .
                 super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                 .
                 super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                 .
                 super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                 .
                 super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
         + 8) = uVar1;
        goto LAB_00c349d8;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,"expected end of shared abstract heap type",
                 (allocator<char> *)
                 ((long)&t.val.
                         super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                         .
                         super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                         .
                         super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                         .
                         super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                         .
                         super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                 + 0x20));
      Lexer::err((Err *)local_58,this,&local_c0);
      std::__detail::__variant::
      _Variant_storage<false,wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,wasm::Err>
      ::_Variant_storage<1ul,wasm::Err>
                ((_Variant_storage<false,wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,wasm::Err>
                  *)__return_storage_ptr__,local_58);
      std::__cxx11::string::~string((string *)local_58);
      this_00 = &local_c0;
      goto LAB_00c34a6f;
    }
    std::__cxx11::string::string
              ((string *)
               ((long)&t.val.
                       super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                       .
                       super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                       .
                       super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                       .
                       super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                       .
                       super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
               + 0x20),(string *)local_58);
    std::__detail::__variant::
    _Variant_storage<false,wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,wasm::Err>
    ::_Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,wasm::Err>
                *)__return_storage_ptr__,
               (__index_type *)
               ((long)&t.val.
                       super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                       .
                       super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                       .
                       super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                       .
                       super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                       .
                       super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
               + 0x20));
  }
  std::__cxx11::string::~string
            ((string *)
             ((long)&t.val.
                     super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                     .
                     super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                     .
                     super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                     .
                     super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                     .
                     super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
             + 0x20));
  std::__detail::__variant::
  _Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
  ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                       *)local_58);
LAB_00c34a74:
  std::__detail::__variant::
  _Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
  ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                       *)auStack_a0);
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::HeapTypeT> heaptype(Ctx& ctx) {
  if (auto t = maybeTypeidx(ctx)) {
    CHECK_ERR(t);
    return *t;
  }

  if (ctx.in.takeSExprStart("exact"sv)) {
    auto t = typeidx(ctx);
    CHECK_ERR(t);
    if (!ctx.in.takeRParen()) {
      return ctx.in.err("expected end of exact heap type");
    }
    return ctx.makeExact(*t);
  }

  auto share = ctx.in.takeSExprStart("shared"sv) ? Shared : Unshared;
  auto t = absheaptype(ctx, share);
  CHECK_ERR(t);
  if (share == Shared && !ctx.in.takeRParen()) {
    return ctx.in.err("expected end of shared abstract heap type");
  }
  return *t;
}